

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp_write.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  in_addr_t iVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  FILE *__stream;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  size_t sStack_500;
  int errlen;
  sockaddr_in sin;
  stat fileinfo;
  char mem [1024];
  
  iVar2 = 0x100007f;
  if ((1 < argc) && (iVar2 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) &&
       ((password = argv[3], argc != 4 && (loclfile = argv[4], 5 < (uint)argc)))) {
      scppath = argv[5];
    }
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __stream = fopen(loclfile,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open local file %s\n",loclfile);
    return 1;
  }
  stat(loclfile,(stat *)&fileinfo);
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fwrite("failed to create socket!\n",0x19,1,_stderr);
    goto LAB_001016f0;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar2;
  iVar4 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar4 == 0) {
    lVar5 = libssh2_session_init_ex(0,0,0,0);
    if (lVar5 == 0) {
      pcVar10 = "Could not initialize SSH session!\n";
      sStack_500 = 0x22;
      goto LAB_0010145c;
    }
    uVar3 = libssh2_session_handshake(lVar5,__fd);
    if (uVar3 == 0) {
      lVar6 = libssh2_hostkey_hash(lVar5,2);
      fwrite("Fingerprint: ",0xd,1,_stderr);
      for (lVar11 = 0; lVar11 != 0x14; lVar11 = lVar11 + 1) {
        fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar11));
      }
      fputc(10,_stderr);
      pcVar10 = username;
      sVar7 = strlen(username);
      pcVar1 = password;
      sVar8 = strlen(password);
      iVar4 = libssh2_userauth_password_ex
                        (lVar5,pcVar10,sVar7 & 0xffffffff,pcVar1,sVar8 & 0xffffffff,0);
      if (iVar4 == 0) {
        lVar6 = libssh2_scp_send_ex(lVar5,scppath,fileinfo.st_mode & 0x1ff,fileinfo.st_size,0,0);
        if (lVar6 == 0) {
          uVar3 = libssh2_session_last_error(lVar5,mem,&errlen,0);
          fprintf(_stderr,"Unable to open a session: (%d) %s\n",(ulong)uVar3,mem._0_8_);
        }
        else {
          fwrite("SCP session waiting to send file\n",0x21,1,_stderr);
LAB_001015f2:
          sVar7 = fread(mem,1,0x400,__stream);
          pcVar10 = mem;
          if (sVar7 != 0) {
            do {
              uVar9 = libssh2_channel_write_ex(lVar6,0,pcVar10,sVar7);
              if ((long)uVar9 < 0) {
                fprintf(_stderr,"ERROR %d\n",uVar9 & 0xffffffff);
                break;
              }
              sVar7 = sVar7 - uVar9;
              pcVar10 = pcVar10 + uVar9;
            } while (sVar7 != 0);
            goto LAB_001015f2;
          }
          fwrite("Sending EOF\n",0xc,1,_stderr);
          libssh2_channel_send_eof(lVar6);
          fwrite("Waiting for EOF\n",0x10,1,_stderr);
          libssh2_channel_wait_eof(lVar6);
          fwrite("Waiting for channel to close\n",0x1d,1,_stderr);
          libssh2_channel_wait_closed(lVar6);
          libssh2_channel_free(lVar6);
        }
      }
      else {
        fwrite("Authentication by password failed!\n",0x23,1,_stderr);
      }
    }
    else {
      fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
    }
    libssh2_session_disconnect_ex(lVar5,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar5);
  }
  else {
    pcVar10 = "failed to connect!\n";
    sStack_500 = 0x13;
LAB_0010145c:
    fwrite(pcVar10,sStack_500,1,_stderr);
  }
  shutdown(__fd,2);
  close(__fd);
LAB_001016f0:
  fclose(__stream);
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    FILE *local;
    char mem[1024];
    size_t nread;
    char *ptr;
    struct stat fileinfo;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        loclfile = argv[4];
    }
    if(argc > 5) {
        scppath = argv[5];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    local = fopen(loclfile, "rb");
    if(!local) {
        fprintf(stderr, "Cannot open local file %s\n", loclfile);
        return 1;
    }

    stat(loclfile, &fileinfo);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed!\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed!\n");
            goto shutdown;
        }
    }

    /* Send a file via scp. The mode parameter must only have permissions! */
    channel = libssh2_scp_send(session, scppath, fileinfo.st_mode & 0777,
                               (size_t)fileinfo.st_size);

    if(!channel) {
        char *errmsg;
        int errlen;
        int err;
        err = libssh2_session_last_error(session, &errmsg, &errlen, 0);
        fprintf(stderr, "Unable to open a session: (%d) %s\n", err, errmsg);
        goto shutdown;
    }

    fprintf(stderr, "SCP session waiting to send file\n");
    do {
        nread = fread(mem, 1, sizeof(mem), local);
        if(nread <= 0) {
            /* end of file */
            break;
        }
        ptr = mem;

        do {
            ssize_t nwritten;
            /* write the same data over and over, until error or completion */
            nwritten = libssh2_channel_write(channel, ptr, nread);
            if(nwritten < 0) {
                fprintf(stderr, "ERROR %d\n", (int)nwritten);
                break;
            }
            else {
                /* nwritten indicates how many bytes were written this time */
                ptr += nwritten;
                nread -= nwritten;
            }
        } while(nread);

    } while(1);

    fprintf(stderr, "Sending EOF\n");
    libssh2_channel_send_eof(channel);

    fprintf(stderr, "Waiting for EOF\n");
    libssh2_channel_wait_eof(channel);

    fprintf(stderr, "Waiting for channel to close\n");
    libssh2_channel_wait_closed(channel);

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    if(local)
        fclose(local);

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return 0;
}